

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent_inlines.h
# Opt level: O2

int extent_esnead_comp(extent_t *a,extent_t *b)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (a->field_2).e_size_esn & 0xfff;
  uVar2 = (b->field_2).e_size_esn & 0xfff;
  iVar1 = (uint)(uVar2 < uVar3) - (uint)(uVar3 < uVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  return (uint)(b < a) - (uint)(a < b);
}

Assistant:

static inline int
extent_esnead_comp(const extent_t *a, const extent_t *b) {
	int ret;

	ret = extent_esn_comp(a, b);
	if (ret != 0) {
		return ret;
	}

	ret = extent_ead_comp(a, b);
	return ret;
}